

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatBuffer.h
# Opt level: O0

void __thiscall
slang::FormatBuffer::format<unsigned_long&>
          (FormatBuffer *this,text_style *style,format_string<unsigned_long_&> fmt,
          unsigned_long *args)

{
  basic_string_view<char> format_str;
  basic_string_view<char> fmt_00;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
  *local_138 [3];
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> local_120;
  FormatBuffer *local_110;
  char *local_108;
  locale_ref local_100;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
  *local_f8 [2];
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> local_e8;
  FormatBuffer *local_d8;
  char *local_d0;
  unsigned_long *local_c8;
  unsigned_long *args_local;
  text_style *style_local;
  FormatBuffer *this_local;
  format_string<unsigned_long_&> fmt_local;
  
  local_108 = (char *)fmt.str_.size_;
  local_110 = (FormatBuffer *)fmt.str_.data_;
  local_c8 = args;
  args_local = (unsigned_long *)style;
  style_local = (text_style *)this;
  this_local = local_110;
  fmt_local.str_.data_ = local_108;
  if ((this->showColors & 1U) == 0) {
    local_d8 = local_110;
    local_d0 = local_108;
    local_f8[0] = ::fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,unsigned_long&>
                            ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
                              *)args,(v9 *)style,(unsigned_long *)local_110);
    fmt_local.str_.size_ = (size_t)local_f8;
    local_e8.desc_ = 4;
    local_e8.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
          )fmt_local.str_.size_;
    ::fmt::v9::detail::locale_ref::locale_ref(&local_100);
    fmt_00.size_ = (size_t)local_d0;
    fmt_00.data_ = (char *)local_d8;
    ::fmt::v9::detail::vformat_to<char>((buffer<char> *)this,fmt_00,local_e8,local_100);
  }
  else {
    local_138[0] = ::fmt::v9::
                   make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,unsigned_long&>
                             ((format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_unsigned_long>
                               *)args,(v9 *)style,(unsigned_long *)local_110);
    local_120.desc_ = 4;
    local_120.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
          )local_138;
    format_str.size_ = (size_t)local_108;
    format_str.data_ = (char *)local_110;
    ::fmt::v9::detail::vformat_to<char>((buffer<char> *)this,style,format_str,local_120);
  }
  return;
}

Assistant:

void format(const fmt::text_style& style, fmt::format_string<Args...> fmt, Args&&... args) {
        if (!showColors) {
            fmt::detail::vformat_to(buf, fmt::string_view(fmt), fmt::make_format_args(args...));
        }
        else {
            fmt::detail::vformat_to(buf, style, fmt::string_view(fmt),
                                    fmt::make_format_args(args...));
        }
    }